

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbsessionmanager.cpp
# Opt level: O0

void sm_setProperty(QString *name,QString *value)

{
  qsizetype qVar1;
  long in_FS_OFFSET;
  SmPropValue prop;
  QByteArray v;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QByteArray *this;
  QByteArray *this_00;
  QByteArray local_50;
  undefined8 local_38;
  char *pcStack_30;
  QByteArray local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.size = -0x5555555555555556;
  local_28.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_28.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  this_00 = &local_28;
  QString::toUtf8((QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_38 = 0xaaaaaaaaaaaaaaaa;
  pcStack_30 = (char *)0xaaaaaaaaaaaaaaaa;
  qVar1 = QByteArray::size(this_00);
  local_38 = CONCAT44(local_38._4_4_,(int)qVar1);
  pcStack_30 = QByteArray::constData((QByteArray *)0x20d44f);
  this = &local_50;
  QString::toLatin1((QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  QByteArray::data(this);
  sm_setProperty((char *)this_00,(char *)this,in_stack_ffffffffffffff8c,(SmPropValue *)0x20d48b);
  QByteArray::~QByteArray((QByteArray *)0x20d495);
  QByteArray::~QByteArray((QByteArray *)0x20d49f);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void sm_setProperty(const QString &name, const QString &value)
{
    QByteArray v = value.toUtf8();
    SmPropValue prop;
    prop.length = v.size();
    prop.value = (SmPointer) const_cast<char *>(v.constData());
    sm_setProperty(name.toLatin1().data(), SmARRAY8, 1, &prop);
}